

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_log_postv(ma_log *pLog,ma_uint32 level,char *pFormat,__va_list_tag *args)

{
  _func_void_ptr_size_t_void_ptr *p_Var1;
  _func_void_void_ptr_void_ptr *p_Var2;
  uint uVar3;
  int iVar4;
  char *__s;
  ulong uVar5;
  void **ppvVar6;
  ma_result mVar7;
  char pFormattedMessageStack [1024];
  char local_438 [1032];
  
  mVar7 = MA_INVALID_ARGS;
  if (pFormat != (char *)0x0 && pLog != (ma_log *)0x0) {
    uVar3 = vsnprintf(local_438,0x400,pFormat,args);
    if ((int)uVar3 < 0) {
      mVar7 = MA_INVALID_OPERATION;
    }
    else if (uVar3 < 0x400) {
      uVar3 = pLog->callbackCount;
      if (uVar3 != 0) {
        ppvVar6 = &pLog->callbacks[0].pUserData;
        uVar5 = 0;
        do {
          if (((ma_log_callback *)(ppvVar6 + -1))->onLog != (ma_log_callback_proc)0x0) {
            (*((ma_log_callback *)(ppvVar6 + -1))->onLog)(*ppvVar6,level,local_438);
            uVar3 = pLog->callbackCount;
          }
          uVar5 = uVar5 + 1;
          ppvVar6 = ppvVar6 + 2;
        } while (uVar5 < uVar3);
      }
      mVar7 = MA_SUCCESS;
    }
    else {
      p_Var1 = (pLog->allocationCallbacks).onMalloc;
      mVar7 = MA_OUT_OF_MEMORY;
      if (p_Var1 != (_func_void_ptr_size_t_void_ptr *)0x0) {
        __s = (char *)(*p_Var1)((ulong)(uVar3 + 1),(pLog->allocationCallbacks).pUserData);
        if (__s != (char *)0x0) {
          iVar4 = vsnprintf(__s,(ulong)(uVar3 + 1),pFormat,args);
          if (iVar4 < 0) {
            p_Var2 = (pLog->allocationCallbacks).onFree;
            mVar7 = MA_INVALID_OPERATION;
          }
          else {
            uVar3 = pLog->callbackCount;
            if (uVar3 != 0) {
              ppvVar6 = &pLog->callbacks[0].pUserData;
              uVar5 = 0;
              do {
                if (((ma_log_callback *)(ppvVar6 + -1))->onLog != (ma_log_callback_proc)0x0) {
                  (*((ma_log_callback *)(ppvVar6 + -1))->onLog)(*ppvVar6,level,__s);
                  uVar3 = pLog->callbackCount;
                }
                uVar5 = uVar5 + 1;
                ppvVar6 = ppvVar6 + 2;
              } while (uVar5 < uVar3);
            }
            p_Var2 = (pLog->allocationCallbacks).onFree;
            mVar7 = MA_SUCCESS;
          }
          if (p_Var2 != (_func_void_void_ptr_void_ptr *)0x0) {
            (*p_Var2)(__s,(pLog->allocationCallbacks).pUserData);
          }
        }
      }
    }
  }
  return mVar7;
}

Assistant:

MA_API ma_result ma_log_postv(ma_log* pLog, ma_uint32 level, const char* pFormat, va_list args)
{
    if (pLog == NULL || pFormat == NULL) {
        return MA_INVALID_ARGS;
    }

    #if (defined(__STDC_VERSION__) && __STDC_VERSION__ >= 199901L) || ((!defined(_MSC_VER) || _MSC_VER >= 1900) && !defined(__STRICT_ANSI__) && !defined(_NO_EXT_KEYS)) || (defined(__cplusplus) && __cplusplus >= 201103L)
    {
        ma_result result;
        int length;
        char  pFormattedMessageStack[1024];
        char* pFormattedMessageHeap = NULL;

        /* First try formatting into our fixed sized stack allocated buffer. If this is too small we'll fallback to a heap allocation. */
        length = vsnprintf(pFormattedMessageStack, sizeof(pFormattedMessageStack), pFormat, args);
        if (length < 0) {
            return MA_INVALID_OPERATION;    /* An error occurred when trying to convert the buffer. */
        }

        if ((size_t)length < sizeof(pFormattedMessageStack)) {
            /* The string was written to the stack. */
            result = ma_log_post(pLog, level, pFormattedMessageStack);
        } else {
            /* The stack buffer was too small, try the heap. */
            pFormattedMessageHeap = (char*)ma_malloc(length + 1, &pLog->allocationCallbacks);
            if (pFormattedMessageHeap == NULL) {
                return MA_OUT_OF_MEMORY;
            }

            length = vsnprintf(pFormattedMessageHeap, length + 1, pFormat, args);
            if (length < 0) {
                ma_free(pFormattedMessageHeap, &pLog->allocationCallbacks);
                return MA_INVALID_OPERATION;
            }

            result = ma_log_post(pLog, level, pFormattedMessageHeap);
            ma_free(pFormattedMessageHeap, &pLog->allocationCallbacks);
        }

        return result;
    }
    #else
    {
        /*
        Without snprintf() we need to first measure the string and then heap allocate it. I'm only aware of Visual Studio having support for this without snprintf(), so we'll
        need to restrict this branch to Visual Studio. For other compilers we need to just not support formatted logging because I don't want the security risk of overflowing
        a fixed sized stack allocated buffer.
        */
        #if defined(_MSC_VER) && _MSC_VER >= 1200   /* 1200 = VC6 */
        {
            ma_result result;
            int formattedLen;
            char* pFormattedMessage = NULL;
            va_list args2;

            #if _MSC_VER >= 1800
            {
                va_copy(args2, args);
            }
            #else
            {
                args2 = args;
            }
            #endif

            formattedLen = ma_vscprintf(&pLog->allocationCallbacks, pFormat, args2);
            va_end(args2);

            if (formattedLen <= 0) {
                return MA_INVALID_OPERATION;
            }

            pFormattedMessage = (char*)ma_malloc(formattedLen + 1, &pLog->allocationCallbacks);
            if (pFormattedMessage == NULL) {
                return MA_OUT_OF_MEMORY;
            }

            /* We'll get errors on newer versions of Visual Studio if we try to use vsprintf().  */
            #if _MSC_VER >= 1400    /* 1400 = Visual Studio 2005 */
            {
                vsprintf_s(pFormattedMessage, formattedLen + 1, pFormat, args);
            }
            #else
            {
                vsprintf(pFormattedMessage, pFormat, args);
            }
            #endif

            result = ma_log_post(pLog, level, pFormattedMessage);
            ma_free(pFormattedMessage, &pLog->allocationCallbacks);

            return result;
        }
        #else
        {
            /* Can't do anything because we don't have a safe way of to emulate vsnprintf() without a manual solution. */
            (void)level;
            (void)args;

            return MA_INVALID_OPERATION;
        }
        #endif
    }
    #endif
}